

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyUriDecode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData,int bUTF8)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *in_RAX;
  int iVar6;
  byte *pbVar7;
  undefined1 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  sxu8 zOut [10];
  undefined4 local_3c;
  undefined1 local_38 [8];
  
  pbVar7 = (byte *)(zSrc + nLen);
  do {
    for (lVar9 = 0; pbVar1 = (byte *)(zSrc + lVar9), pbVar1 < pbVar7; lVar9 = lVar9 + 1) {
      bVar2 = *pbVar1;
      in_RAX = (byte *)(ulong)bVar2;
      if ((bVar2 == 0x25) || (bVar2 == 0x2b)) {
        if (lVar9 != 0) goto LAB_0011ff02;
        if (pbVar7 <= pbVar1) goto LAB_00120099;
        goto LAB_0011ff1f;
      }
    }
    if (lVar9 == 0) break;
LAB_0011ff02:
    uVar5 = (*xConsumer)(zSrc,(uint)lVar9,pUserData);
    in_RAX = (byte *)(ulong)uVar5;
    if ((pbVar7 <= pbVar1) || (uVar5 != 0)) break;
LAB_0011ff1f:
    if (zSrc[lVar9] == '+') {
      local_3c = CONCAT31(local_3c._1_3_,0x20);
      pcVar11 = zSrc + lVar9 + 1;
LAB_0011ffcf:
      iVar6 = (int)&local_3c + 1;
    }
    else {
      in_RAX = (byte *)(zSrc + lVar9 + 2);
      if (pbVar7 <= in_RAX) break;
      pcVar11 = zSrc + lVar9 + 3;
      uVar5 = SyAsciiToHex((int)zSrc[lVar9 + 1]);
      uVar3 = SyAsciiToHex((int)zSrc[lVar9 + 2]);
      uVar3 = uVar3 | uVar5 << 4;
      if (uVar5 < 0xc) {
        local_3c = CONCAT31(local_3c._1_3_,(char)uVar3);
        goto LAB_0011ffcf;
      }
      uVar10 = (ulong)""[uVar3 - 0xc0];
      while ((uVar5 = (uint)uVar10, *pcVar11 == '%' &&
             (uVar3 = SyAsciiToHex((int)pcVar11[1]), (uVar3 & 0xc) == 8))) {
        uVar4 = SyAsciiToHex((int)pcVar11[2]);
        uVar10 = (ulong)(uVar5 << 6 | uVar4 | (uVar3 & 3) << 4);
        pcVar11 = pcVar11 + 3;
      }
      uVar8 = (undefined1)uVar10;
      if ((int)uVar5 < 0x80) {
        local_3c = CONCAT31(local_3c._1_3_,uVar8);
        goto LAB_0011ffcf;
      }
      if (uVar5 < 0x800) {
        local_3c = CONCAT22(local_3c._2_2_,CONCAT11(uVar8,(char)(uVar10 >> 6))) & 0xffff3fff |
                   0x80c0;
        iVar6 = (int)&local_3c + 2;
      }
      else if (uVar5 < 0x10000) {
        uVar5 = CONCAT22(local_3c._2_2_,CONCAT11((char)(uVar10 >> 6),(char)(uVar5 >> 0xc))) &
                0xffff3fff;
        local_3c._3_1_ = (undefined1)(uVar5 >> 0x18);
        local_3c = CONCAT13(local_3c._3_1_,CONCAT12(uVar8,(short)uVar5)) & 0xff3fffff | 0x8080e0;
        iVar6 = (int)&local_3c + 3;
      }
      else {
        local_3c = (uVar5 << 0x18 |
                   (uVar5 & 0x3fc0) << 10 | uVar5 >> 0x12 & 0xff | (uint)(uVar10 >> 4) & 0xff00) &
                   (uint)DAT_0013a940 | (uint)DAT_0013a950;
        iVar6 = (int)local_38;
      }
    }
    uVar5 = (*xConsumer)(&local_3c,iVar6 - (int)&local_3c,pUserData);
    in_RAX = (byte *)(ulong)uVar5;
    zSrc = pcVar11;
  } while (uVar5 == 0);
LAB_00120099:
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 SyUriDecode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData, int bUTF8)
{
	static const sxu8 Utf8Trans[] = {
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17, 
		0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x00, 0x01, 0x02, 0x03, 0x00, 0x01, 0x00, 0x00
	};
	const char *zIn = zSrc;
	const char *zEnd;
	const char *zCur;
	sxu8 *zOutPtr;
	sxu8 zOut[10];
	sxi32 c, d;
	sxi32 rc;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	rc = SXRET_OK;
	zEnd = &zSrc[nLen];
	zCur = zIn;
	for(;;){
		while(zCur < zEnd && zCur[0] != '%' && zCur[0] != '+' ){
			zCur++;
		}
		if( zCur != zIn ){
			/* Consume input */
			rc = xConsumer(zIn, (unsigned int)(zCur-zIn), pUserData);
			if( rc != SXRET_OK ){
				/* User consumer routine request an operation abort */
				break;
			}
		}
		if( zCur >= zEnd ){
			rc = SXRET_OK;
			break;
		}
		/* Decode unsafe HTTP characters */
		zOutPtr = zOut;
		if( zCur[0] == '+' ){
			*zOutPtr++ = ' ';
			zCur++;
		}else{
			if( &zCur[2] >= zEnd ){
				rc = SXERR_OVERFLOW;
				break;
			}
			c = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
			zCur += 3;
			if( c < 0x000C0 ){
				*zOutPtr++ = (sxu8)c;
			}else{
				c = Utf8Trans[c-0xC0];
				while( zCur[0] == '%' ){
					d = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
					if( (d&0xC0) != 0x80 ){
						break;
					}
					c = (c<<6) + (0x3f & d);
					zCur += 3;
				}
				if( bUTF8 == FALSE ){
					*zOutPtr++ = (sxu8)c;
				}else{
					SX_WRITE_UTF8(zOutPtr, c);
				}
			}
			
		}
		/* Consume the decoded characters */
		rc = xConsumer((const void *)zOut, (unsigned int)(zOutPtr-zOut), pUserData);
		if( rc != SXRET_OK ){
			break;
		}
		/* Synchronize pointers */
		zIn = zCur;
	}
	return rc;
}